

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

QMap<int,_QVariant> __thiscall QListModel::itemData(QListModel *this,QModelIndex *index)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  int *in_RDX;
  long lVar4;
  
  *(undefined8 *)this = 0;
  uVar2 = (ulong)*in_RDX;
  if ((((-1 < (long)uVar2) && (-1 < in_RDX[1])) && (*(long *)(in_RDX + 4) != 0)) &&
     (uVar2 < index[1].i)) {
    lVar1 = *(long *)(*(long *)(index + 1) + uVar2 * 8);
    lVar3 = *(long *)(lVar1 + 0x18);
    if (*(long *)(lVar3 + 0x18) != 0) {
      lVar4 = 8;
      uVar2 = 0;
      do {
        QMap<int,_QVariant>::insert
                  ((QMap<int,_QVariant> *)this,(int *)(*(long *)(lVar3 + 0x10) + lVar4 + -8),
                   (QVariant *)(*(long *)(lVar3 + 0x10) + lVar4));
        uVar2 = uVar2 + 1;
        lVar3 = *(long *)(lVar1 + 0x18);
        lVar4 = lVar4 + 0x28;
      } while (uVar2 < *(ulong *)(lVar3 + 0x18));
    }
  }
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )this;
}

Assistant:

QMap<int, QVariant> QListModel::itemData(const QModelIndex &index) const
{
    QMap<int, QVariant> roles;
    if (!index.isValid() || index.row() >= items.size())
        return roles;
    QListWidgetItem *itm = items.at(index.row());
    for (int i = 0; i < itm->d->values.size(); ++i) {
        roles.insert(itm->d->values.at(i).role,
                     itm->d->values.at(i).value);
    }
    return roles;
}